

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O0

int AF_A_KoraxDecide(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  int iVar1;
  FState *pFVar2;
  bool bVar3;
  bool local_56;
  bool local_53;
  FName local_50;
  FName local_4c;
  void *local_48;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                  ,0xcc,"int AF_A_KoraxDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_53 = true;
    if (stateowner != (AActor *)0x0) {
      local_53 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_53 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                    ,0xcc,"int AF_A_KoraxDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                      ,0xcc,"int AF_A_KoraxDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_56 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_56 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_56 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                      ,0xcc,"int AF_A_KoraxDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                      ,0xcc,"int AF_A_KoraxDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      local_48 = pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      local_48 = (void *)0x0;
    }
    iVar1 = FRandom::operator()(&pr_koraxdecide);
    this = stateowner;
    if (iVar1 < 0xdc) {
      FName::FName(&local_4c,"Attack");
      pFVar2 = AActor::FindState(this,&local_4c);
      AActor::SetState(this,pFVar2,false);
    }
    else {
      FName::FName(&local_50,"Command");
      pFVar2 = AActor::FindState(this,&local_50);
      AActor::SetState(this,pFVar2,false);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                ,0xcc,"int AF_A_KoraxDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KoraxDecide)
{
	PARAM_ACTION_PROLOGUE;

	if (pr_koraxdecide()<220)
	{
		self->SetState (self->FindState("Attack"));
	}
	else
	{
		self->SetState (self->FindState("Command"));
	}
	return 0;
}